

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  LogMessage local_1b0;
  char *pcVar5;
  
  pcVar4 = rewrite->ptr_;
  pcVar3 = pcVar4 + rewrite->length_;
  do {
    if (pcVar3 <= pcVar4) {
LAB_00133a08:
      return pcVar3 <= pcVar4;
    }
    if (*pcVar4 != '\\') {
      std::__cxx11::string::push_back((char)out);
      pcVar5 = pcVar4;
      goto LAB_0013394f;
    }
    pcVar5 = pcVar4 + 1;
    if (pcVar3 <= pcVar5) {
LAB_00133954:
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x37e,2);
        poVar2 = std::operator<<((ostream *)&local_1b0.str_,"invalid rewrite pattern: ");
        std::operator<<(poVar2,rewrite->ptr_);
LAB_001339fe:
        LogMessage::~LogMessage(&local_1b0);
      }
      goto LAB_00133a08;
    }
    uVar1 = (int)*pcVar5 - 0x30;
    if (uVar1 < 10) {
      if (veclen <= (int)uVar1) {
        if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x372,2);
          poVar2 = std::operator<<((ostream *)&local_1b0.str_,"requested group ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
          poVar2 = std::operator<<(poVar2," in regexp ");
          std::operator<<(poVar2,rewrite->ptr_);
          goto LAB_001339fe;
        }
        goto LAB_00133a08;
      }
      if (0 < vec[uVar1].length_) {
        std::__cxx11::string::append((char *)out,(ulong)vec[uVar1].ptr_);
      }
    }
    else {
      if (*pcVar5 != '\\') goto LAB_00133954;
      std::__cxx11::string::push_back((char)out);
    }
LAB_0013394f:
    pcVar4 = pcVar5 + 1;
  } while( true );
}

Assistant:

bool RE2::Rewrite(string *out, const StringPiece &rewrite,
                 const StringPiece *vec, int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "requested group " << n
                     << " in regexp " << rewrite.data();
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (snip.size() > 0)
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}